

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O0

CSerializedNetMsg *
NetMsg::Make<std::vector<CBlockHeader,std::allocator<CBlockHeader>>>
          (string *msg_type,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *args)

{
  size_t in_RSI;
  CSerializedNetMsg *in_RDI;
  long in_FS_OFFSET;
  CSerializedNetMsg *msg;
  CSerializedNetMsg *in_stack_ffffffffffffff98;
  CSerializedNetMsg *vchDataIn;
  VectorWriter *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  vchDataIn = in_RDI;
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this,in_stack_fffffffffffffff0);
  VectorWriter::VectorWriter<std::vector<CBlockHeader,std::allocator<CBlockHeader>>>
            (in_stack_ffffffffffffffb8,&vchDataIn->data,in_RSI,
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_RDI);
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      != this) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }